

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O1

void string_suite::test_string(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  string data;
  writer writer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  string_view_type local_b0;
  size_type local_a0;
  long *local_98;
  size_t local_90;
  long local_88 [2];
  type local_78;
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  local_68;
  
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::basic_writer<16ul>::
  basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&local_78.__align,&local_c8);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ABC","");
  local_b0._M_len = local_90;
  local_b0._M_str = (char *)local_98;
  local_a0 = trial::protocol::bintoken::detail::basic_encoder<16UL>::value
                       ((basic_encoder<16UL> *)&local_78.__align,&local_b0);
  local_b0._M_len = CONCAT44(local_b0._M_len._4_4_,5);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(data)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x129,"void string_suite::test_string()",&local_a0,&local_b0);
  local_b0._M_len =
       (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_a0 = CONCAT44(local_a0._4_4_,5);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("result.size()","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x12a,"void string_suite::test_string()",&local_b0,&local_a0);
  local_b0._M_len._0_4_ = 0xa9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("result[0]","token::code::string8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,299,"void string_suite::test_string()",
             local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_b0);
  local_b0._M_len._0_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[1]","0x03",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,300,"void string_suite::test_string()",
             local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 1,&local_b0);
  local_b0._M_len._0_4_ = 0x41;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[2]","0x41",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x12d,"void string_suite::test_string()",
             local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 2,&local_b0);
  local_b0._M_len._0_4_ = 0x42;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[3]","0x42",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x12e,"void string_suite::test_string()",
             local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 3,&local_b0);
  local_b0._M_len = CONCAT44(local_b0._M_len._4_4_,0x43);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[4]","0x43",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x12f,"void string_suite::test_string()",
             local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 4,&local_b0);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base(&local_68);
  (**(code **)local_78._0_8_)(&local_78);
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_uint8()
{
    std::vector<output_type> result;
    format::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x00)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x7F)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xD0)), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xFF)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 0x00);
    TRIAL_PROTOCOL_TEST_EQUAL(result[1], 0x7F);
    TRIAL_PROTOCOL_TEST_EQUAL(result[2], token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(result[3], 0xD0);
    TRIAL_PROTOCOL_TEST_EQUAL(result[4], 0xFF);
}